

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::WritableFileMapping,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryFile::mmapWritable(InMemoryFile *this,uint64_t offset,uint64_t size)

{
  bool bVar1;
  Impl *pIVar2;
  long in_RCX;
  WritableFileMapping *extraout_RDX;
  Own<const_kj::WritableFileMapping,_std::nullptr_t> OVar3;
  ArrayPtr<unsigned_char> local_c0;
  Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> local_b0;
  Own<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl,_std::nullptr_t> local_a0;
  undefined1 local_88 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_68;
  Fault f;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  uint64_t end;
  uint64_t size_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  _kjCondition._32_8_ = size + in_RCX;
  size_local = size;
  offset_local = offset;
  this_local = this;
  f.exception = (Exception *)
                _::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                           (unsigned_long *)&_kjCondition.result);
  _::DebugExpression<unsigned_long&>::operator>=
            ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_58,
             (DebugExpression<unsigned_long&> *)&f,&size_local);
  bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[40]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x36a,FAILED,"end >= offset",
               "_kjCondition,\"mmapWritable() request overflows uint64\"",
               (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_58,
               (char (*) [40])"mmapWritable() request overflows uint64");
    _::Debug::Fault::fatal(&local_68);
  }
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88,offset + 0x18);
  pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
  Impl::ensureCapacity(pIVar2,_kjCondition._32_8_);
  atomicAddRef<kj::(anonymous_namespace)::InMemoryFile>((kj *)&local_b0,(InMemoryFile *)offset);
  pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
  local_c0 = Array<unsigned_char>::slice(&pIVar2->bytes,size_local,_kjCondition._32_8_);
  heap<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl,kj::Own<kj::(anonymous_namespace)::InMemoryFile_const,decltype(nullptr)>,kj::ArrayPtr<unsigned_char>>
            ((kj *)&local_a0,&local_b0,&local_c0);
  Own<kj::WritableFileMapping_const,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl,void>
            ((Own<kj::WritableFileMapping_const,decltype(nullptr)> *)this,&local_a0);
  Own<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl,_std::nullptr_t>::~Own
            (&local_a0);
  Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own(&local_b0);
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    uint64_t end = offset + size;
    KJ_REQUIRE(end >= offset, "mmapWritable() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(end);
    return heap<WritableFileMappingImpl>(atomicAddRef(*this), lock->bytes.slice(offset, end));
  }